

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Address *a)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(a->country)._M_dataplus._M_p,(a->country)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(a->city)._M_dataplus._M_p,(a->city)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(a->street)._M_dataplus._M_p,(a->street)._M_string_length);
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Address &a) {
    out << a.country << " , " << a.city << " , " << a.street;
    return out;
}